

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

void js_std_init_handlers(JSRuntime *rt)

{
  JSRuntime *in_RDI;
  JSSharedArrayBufferFunctions sf;
  JSThreadState *ts;
  JSSharedArrayBufferFunctions local_30;
  list_head *local_10;
  JSRuntime *local_8;
  
  local_8 = in_RDI;
  local_10 = (list_head *)malloc(0x58);
  if (local_10 == (list_head *)0x0) {
    fprintf(_stderr,"Could not allocate memory for the worker");
    exit(1);
  }
  memset(local_10,0,0x58);
  init_list_head(local_10);
  init_list_head(local_10 + 1);
  init_list_head(local_10 + 2);
  init_list_head(local_10 + 3);
  JS_SetRuntimeOpaque(local_8,local_10);
  memset(&local_30,0,0x20);
  local_30.sab_alloc = js_sab_alloc;
  local_30.sab_free = js_sab_free;
  local_30.sab_dup = js_sab_dup;
  JS_SetSharedArrayBufferFunctions(local_8,&local_30);
  return;
}

Assistant:

void js_std_init_handlers(JSRuntime *rt)
{
    JSThreadState *ts;

    ts = malloc(sizeof(*ts));
    if (!ts) {
        fprintf(stderr, "Could not allocate memory for the worker");
        exit(1);
    }
    memset(ts, 0, sizeof(*ts));
    init_list_head(&ts->os_rw_handlers);
    init_list_head(&ts->os_signal_handlers);
    init_list_head(&ts->os_timers);
    init_list_head(&ts->port_list);

    JS_SetRuntimeOpaque(rt, ts);

#ifdef USE_WORKER
    /* set the SharedArrayBuffer memory handlers */
    {
        JSSharedArrayBufferFunctions sf;
        memset(&sf, 0, sizeof(sf));
        sf.sab_alloc = js_sab_alloc;
        sf.sab_free = js_sab_free;
        sf.sab_dup = js_sab_dup;
        JS_SetSharedArrayBufferFunctions(rt, &sf);
    }
#endif
}